

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intDup.c
# Opt level: O3

Aig_Man_t * Inter_ManStartInitState(int nRegs)

{
  Aig_Obj_t **pArgs;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar1;
  ulong uVar2;
  
  if (0 < nRegs) {
    pArgs = (Aig_Obj_t **)malloc((ulong)(uint)nRegs * 8);
    p = Aig_ManStart(nRegs);
    uVar2 = 0;
    do {
      pAVar1 = Aig_ObjCreateCi(p);
      pArgs[uVar2] = (Aig_Obj_t *)((ulong)pAVar1 ^ 1);
      uVar2 = uVar2 + 1;
    } while ((uint)nRegs != uVar2);
    pAVar1 = Aig_Multi(p,pArgs,nRegs,AIG_OBJ_AND);
    Aig_ObjCreateCo(p,pAVar1);
    free(pArgs);
    return p;
  }
  __assert_fail("nRegs > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intDup.c"
                ,0x33,"Aig_Man_t *Inter_ManStartInitState(int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Create trivial AIG manager for the init state.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Inter_ManStartInitState( int nRegs )
{
    Aig_Man_t * p;
    Aig_Obj_t * pRes;
    Aig_Obj_t ** ppInputs;
    int i;
    assert( nRegs > 0 );
    ppInputs = ABC_ALLOC( Aig_Obj_t *, nRegs );
    p = Aig_ManStart( nRegs );
    for ( i = 0; i < nRegs; i++ )
        ppInputs[i] = Aig_Not( Aig_ObjCreateCi(p) );
    pRes = Aig_Multi( p, ppInputs, nRegs, AIG_OBJ_AND );
    Aig_ObjCreateCo( p, pRes );
    ABC_FREE( ppInputs );
    return p;
}